

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntestc.c
# Opt level: O3

int main(int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Boolean BVar4;
  long nominal_stack;
  undefined1 local_1c [4];
  undefined1 local_18 [8];
  
  MPI_Init(local_1c,local_18);
  GA_Initialize();
  uVar1 = GA_Nnodes();
  iVar2 = GA_Nodeid();
  if (iVar2 == 0) {
    printf("Using %d processes\n\n",(ulong)uVar1);
  }
  nominal_stack = (long)(int)(300000 / (long)(int)uVar1);
  BVar4 = MA_init(0x3f5,nominal_stack,nominal_stack);
  if (BVar4 == 0) {
    GA_Error("MA_init failed bytes= %d",600000);
  }
  iVar3 = GA_Uses_fapi();
  if (iVar3 != 0) {
    GA_Error("Program runs with C API only",1);
  }
  do_work();
  if (iVar2 == 0) {
    puts("\nAll tests successful\n");
  }
  GA_Terminate();
  MPI_Finalize();
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
Integer heap=300000, stack=300000;
int me, nproc;

    MP_INIT(argc,argv);

    GA_INIT(argc,argv);                           /* initialize GA */

    nproc = GA_Nnodes();
    me = GA_Nodeid();

    if(me==0) printf("Using %d processes\n\n",nproc);

    if(!MA_init((Integer)MT_F_DBL, stack/nproc, heap/nproc))
       GA_Error("MA_init failed bytes= %d",stack+heap);   

    if(GA_Uses_fapi())GA_Error("Program runs with C API only",1);
    
    do_work();

    if(me==0)printf("\nAll tests successful\n\n");
    GA_Terminate();

    MP_FINALIZE();

    return 0;
}